

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

bool __thiscall DReachabilityPropagator::propagateNewEdge(DReachabilityPropagator *this,int edge)

{
  Tint *pTVar1;
  pointer piVar2;
  bool bVar3;
  int *pt;
  int *added_node;
  pointer __v;
  vector<int,_std::allocator<int>_> added_nodes;
  TrailElem local_58;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar3 = GraphPropagator::coherence_innodes(&this->super_GraphPropagator,edge,&local_48);
  piVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (bVar3) {
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      __v = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
      do {
        pTVar1 = this->last_state_n + *__v;
        local_58.x = pTVar1->v;
        local_58.sz = 4;
        local_58.pt = &pTVar1->v;
        vec<TrailElem>::push(&engine.trail,&local_58);
        pTVar1->v = 0;
        add_innode(this,*__v);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &this->new_node,__v);
        __v = __v + 1;
      } while (__v != piVar2);
    }
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool DReachabilityPropagator::propagateNewEdge(int edge) {
	assert(getEdgeVar(edge).isFixed());
	assert(getEdgeVar(edge).isTrue());
	std::vector<int> added_nodes;
	const bool ok = GraphPropagator::coherence_innodes(edge, added_nodes);
	if (!ok) {
		return false;
	}
	for (const int& added_node : added_nodes) {
		if (DEBUG) {
			std::cout << "Adding in " << __FILE__ << __LINE__ << '\n';
		}
		last_state_n[added_node] = VT_IN;
		add_innode(added_node);
		new_node.insert(added_node);
	}
	return true;
}